

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
Filter::predict(vector<float,_std::allocator<float>_> *__return_storage_ptr__,Filter *this)

{
  long lVar1;
  float *pfVar2;
  Mat *pMVar3;
  float fVar4;
  double dVar5;
  int local_100;
  int i;
  Mat estimated;
  Mat local_88 [96];
  double local_28;
  double dT;
  double precTick;
  Filter *this_local;
  vector<float,_std::allocator<float>_> *res;
  
  dT = this->ticks;
  precTick = (double)this;
  this_local = (Filter *)__return_storage_ptr__;
  lVar1 = cv::getTickCount();
  this->ticks = (double)lVar1;
  dVar5 = this->ticks - dT;
  local_28 = (double)cv::getTickFrequency();
  local_28 = dVar5 / local_28;
  fVar4 = (float)local_28;
  pMVar3 = &(this->KF).transitionMatrix;
  pfVar2 = cv::Mat::at<float>(pMVar3,2);
  *pfVar2 = fVar4;
  fVar4 = (float)local_28;
  pfVar2 = cv::Mat::at<float>(pMVar3,7);
  *pfVar2 = fVar4;
  cv::Mat::Mat(local_88);
  cv::KalmanFilter::predict(&(this->KF).statePre);
  cv::Mat::~Mat(local_88);
  pMVar3 = (Mat *)cv::KalmanFilter::correct(&(this->KF).statePre);
  cv::Mat::Mat((Mat *)&i,pMVar3);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  for (local_100 = 0; local_100 < this->stateSize; local_100 = local_100 + 1) {
    pfVar2 = cv::Mat::at<float>((Mat *)&i,local_100);
    std::vector<float,std::allocator<float>>::emplace_back<float&>
              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,pfVar2);
  }
  cv::Mat::~Mat((Mat *)&i);
  return __return_storage_ptr__;
}

Assistant:

vector<float> Filter::predict() {
    double precTick = ticks;
    ticks = (double) getTickCount();
    double dT = (ticks - precTick) / getTickFrequency();

    KF.transitionMatrix.at<float>(2) = dT;
    KF.transitionMatrix.at<float>(7) = dT;
    KF.predict();
    Mat estimated = KF.correct(meas);
    vector<float> res;
    for (int i = 0; i < stateSize; i++) {
        res.emplace_back(estimated.at<float>(i));
    }
    return res;
}